

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgraphel.cpp
# Opt level: O2

void __thiscall
TPZGraphEl::DrawSolutionT<std::complex<double>>
          (TPZGraphEl *this,TPZGraphNode *n,TPZVec<int> *solind,TPZDrawStyle st)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  long *plVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int incr;
  long local_1e0;
  ulong local_1d8;
  TPZVec<int> *local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  TPZManVector<int,_3> co;
  TPZManVector<double,_4> qsi;
  complex<double> local_148;
  TPZManVector<double,_4> x;
  TPZManVector<std::complex<double>,_10> sol;
  
  uVar12 = (ulong)st;
  uVar2 = ConnectNum(this,n);
  iVar3 = (*(this->super_TPZSavable)._vptr_TPZSavable[0x11])(this);
  sol.super_TPZVec<std::complex<double>_>._vptr_TPZVec =
       (_func_int **)((ulong)sol.super_TPZVec<std::complex<double>_>._vptr_TPZVec._4_4_ << 0x20);
  TPZManVector<int,_3>::TPZManVector(&co,(long)iVar3,(int *)&sol);
  (*(this->super_TPZSavable)._vptr_TPZSavable[0x14])(this,(ulong)uVar2,&co,&incr);
  iVar1 = this->fGraphMesh->fResolution;
  uVar10 = solind->fNElements;
  iVar4 = (*(this->super_TPZSavable)._vptr_TPZSavable[0xe])(this,n);
  sol.super_TPZVec<std::complex<double>_>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_4>::TPZManVector(&qsi,(long)iVar3,(double *)&sol);
  sol.super_TPZVec<std::complex<double>_>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_4>::TPZManVector(&x,4,(double *)&sol);
  local_148._M_value._0_8_ = 0;
  local_148._M_value._8_8_ = 0;
  TPZManVector<std::complex<double>,_10>::TPZManVector(&sol,6,&local_148);
  local_1e0 = TPZGraphNode::FirstPoint(n);
  uVar11 = 0;
  if ((long)uVar10 < 1) {
    uVar10 = uVar11;
  }
  local_1d0 = solind;
  local_1c8 = uVar12;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (; (int)uVar11 != iVar4; uVar11 = (ulong)((int)uVar11 + 1)) {
    (*(this->super_TPZSavable)._vptr_TPZSavable[0x16])
              (this,&co,(ulong)(uint)(1 << ((byte)iVar1 & 0x1f)));
    if (st - EMVStyle < 2) {
      poVar6 = std::ostream::_M_insert<long>((long)&this->fGraphMesh->fOutFile);
      std::operator<<(poVar6," ");
      local_1e0 = local_1e0 + 1;
    }
    uVar9 = 0;
    local_1c0 = uVar11;
    while (uVar9 != uVar10) {
      local_1d8 = uVar9;
      (**(code **)(*(long *)this->fCompEl + 0x1b8))(this->fCompEl,&qsi,solind->fStore[uVar9],&sol);
      plVar7 = (long *)(**(code **)(*(long *)this->fCompEl + 0xb8))();
      uVar5 = (**(code **)(*plVar7 + 0x88))(plVar7,solind->fStore[local_1d8]);
      uVar8 = 9;
      if ((int)uVar5 < 9) {
        uVar8 = uVar5;
      }
      if ((int)uVar12 != 3) {
        uVar8 = uVar5;
      }
      uVar9 = 0;
      if (0 < (int)uVar8) {
        uVar9 = (ulong)uVar8;
      }
      for (lVar13 = 0; uVar9 << 4 != lVar13; lVar13 = lVar13 + 0x10) {
        poVar6 = std::ostream::_M_insert<double>
                           ((double)(~-(ulong)(ABS(*(double *)
                                                    ((sol.super_TPZVec<std::complex<double>_>.fStore
                                                     )->_M_value + lVar13)) < 1e-20) &
                                    (ulong)*(double *)
                                            ((sol.super_TPZVec<std::complex<double>_>.fStore)->
                                             _M_value + lVar13)));
        std::operator<<(poVar6," ");
      }
      if ((st - EMVStyle < 2) && (uVar8 == 2)) {
        poVar6 = std::ostream::_M_insert<double>(0.0);
        std::operator<<(poVar6," ");
      }
      uVar11 = local_1c0;
      uVar12 = local_1c8;
      if ((((int)local_1c8 == 3) && (uVar8 != 1)) && ((int)uVar8 < 3)) {
        iVar3 = (int)uVar9 + -3;
        do {
          poVar6 = std::ostream::_M_insert<double>(0.0);
          std::operator<<(poVar6," ");
          iVar3 = iVar3 + 1;
        } while (iVar3 != 0);
      }
      solind = local_1d0;
      uVar9 = local_1d8 + 1;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&this->fGraphMesh->fOutFile);
    (*(this->super_TPZSavable)._vptr_TPZSavable[0x15])(this,(ulong)uVar2,&co,(ulong)(uint)incr);
  }
  TPZManVector<std::complex<double>,_10>::~TPZManVector(&sol);
  TPZManVector<double,_4>::~TPZManVector(&x);
  TPZManVector<double,_4>::~TPZManVector(&qsi);
  TPZManVector<int,_3>::~TPZManVector(&co);
  return;
}

Assistant:

void TPZGraphEl::DrawSolutionT(TPZGraphNode *n,TPZVec<int> &solind,TPZDrawStyle st)
{
	int in = ConnectNum(n);
	//int i,j,incr;
	int incr;
    int dim = Dimension();
	TPZManVector<int,3> co(dim,0);
	FirstIJ(in,co,incr);
	//	ComputeSequence(n, ibound, incr);
	int res = fGraphMesh->Res();
	int imax;
	int64_t numsol = solind.NElements();
	int numvar;
	imax = 1 << res;
	int np = NPoints(n);
	int point=0;
	TPZManVector<REAL,4> qsi(dim,0.),x(4,0.);
	TPZManVector<TVar,10> sol(6,0.);
	int64_t ip = n->FirstPoint();
	while(point < np) 
	{
		QsiEta(co,imax,qsi);
		if(st == EMVStyle || st == EV3DStyle) fGraphMesh->Out() << ip++ << " ";
		for(int64_t is=0; is<numsol; is++) 
		{
			fCompEl->Solution(qsi,solind[is],sol);
			numvar = fCompEl->Material()->NSolutionVariables(solind[is]);
			if(st == EVTKStyle)
			{
				if(numvar > 9) numvar = 9; // Because it 3x3 tensor variables
			}
			int iv;
			for(iv=0; iv<numvar;iv++)
			{
				auto solprint = [&sol,iv](){
					if constexpr (std::is_same_v<TVar, RTVar>) {
						return sol[iv];
					} else {
						return std::real(sol[iv]);
					}
				}();
				
				if (fabs(solprint) < 1.0e-20)
					{solprint = 0.0;}
				fGraphMesh->Out() << solprint << " ";
			}
			if ((st == EMVStyle || st == EV3DStyle) && numvar == 2)
				{fGraphMesh->Out() << 0. << " ";}
			if(st == EVTKStyle && numvar != 1){
				for(; iv<3; iv++) fGraphMesh->Out() << 0. << " ";
			}
		}
		fGraphMesh->Out() << endl;
		NextIJ(in,co,incr);
		point++;
	}
}